

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

result_type __thiscall
WellTestCase<Well<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_Detail::M3<-21>,_Detail::M3<6>,_Detail::M0,_Detail::M3<-13>,_Detail::M3<13>,_Detail::M2<-10>,_Detail::M2<-5>,_Detail::M3<13>,_Detail::NoTempering>,_3076024310U>
::generate(WellTestCase<Well<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_Detail::M3<_21>,_Detail::M3<6>,_Detail::M0,_Detail::M3<_13>,_Detail::M3<13>,_Detail::M2<_10>,_Detail::M2<_5>,_Detail::M3<13>,_Detail::NoTempering>,_3076024310U>
           *this)

{
  result_type rVar1;
  long lVar2;
  int iVar3;
  uint *p;
  uint state [17];
  uint *local_60;
  uint local_58 [18];
  
  for (lVar2 = 0; lVar2 != 0x44; lVar2 = lVar2 + 4) {
    *(undefined4 *)((long)local_58 + lVar2) = 1;
  }
  local_60 = local_58;
  Well<unsigned_int,32ul,17ul,23ul,11ul,10ul,7ul,Detail::M3<-21>,Detail::M3<6>,Detail::M0,Detail::M3<-13>,Detail::M3<13>,Detail::M2<-10>,Detail::M2<-5>,Detail::M3<13>,Detail::NoTempering>
  ::seed<unsigned_int*>
            ((Well<unsigned_int,32ul,17ul,23ul,11ul,10ul,7ul,Detail::M3<_21>,Detail::M3<6>,Detail::M0,Detail::M3<_13>,Detail::M3<13>,Detail::M2<_10>,Detail::M2<_5>,Detail::M3<13>,Detail::NoTempering>
              *)this,&local_60,local_58 + 0x11);
  rVar1 = 0;
  for (iVar3 = -1000000000; iVar3 != 0; iVar3 = iVar3 + 1) {
    rVar1 = Well<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_Detail::M3<-21>,_Detail::M3<6>,_Detail::M0,_Detail::M3<-13>,_Detail::M3<13>,_Detail::M2<-10>,_Detail::M2<-5>,_Detail::M3<13>,_Detail::NoTempering>
            ::operator()(&this->rng);
  }
  return rVar1;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, RandomNumberGenerator::state_size, 1);

        unsigned* p = state;
        rng.seed(p, p + RandomNumberGenerator::state_size);

        result_type x = 0;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }